

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addresses.cpp
# Opt level: O2

UniValue * __thiscall
wallet::DescribeWalletAddressVisitor::operator()
          (UniValue *__return_storage_ptr__,DescribeWalletAddressVisitor *this,
          WitnessV0ScriptHash *id)

{
  SigningProvider *pSVar1;
  string str;
  int iVar2;
  CRIPEMD160 *this_00;
  long in_FS_OFFSET;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0c [12];
  uint160 hash;
  CRIPEMD160 hasher;
  CScript subscript;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = local_38;
  local_40 = 0;
  local_38[0] = 0;
  str._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffefc;
  str._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffef8;
  str._M_string_length._0_4_ = in_stack_ffffffffffffff00;
  str._M_string_length._4_4_ = in_stack_ffffffffffffff04;
  str.field_2._M_allocated_capacity._0_4_ = in_stack_ffffffffffffff08;
  str.field_2._4_12_ = in_stack_ffffffffffffff0c;
  UniValue::UniValue(__return_storage_ptr__,VOBJ,str);
  std::__cxx11::string::~string((string *)&local_48);
  subscript.super_CScriptBase._union._16_8_ = 0;
  subscript.super_CScriptBase._24_8_ = 0;
  subscript.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  subscript.super_CScriptBase._union._8_8_ = 0;
  CRIPEMD160::CRIPEMD160(&hasher);
  hash.super_base_blob<160U>.m_data._M_elems[0] = '\0';
  hash.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  hash.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  hash.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  hash.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  hash.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  hash.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  hash.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  hash.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  hash.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  hash.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  hash.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  hash.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  hash.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  hash.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  hash.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  hash.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  hash.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  hash.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  hash.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  this_00 = CRIPEMD160::Write(&hasher,(uchar *)id,0x20);
  CRIPEMD160::Finalize(this_00,(uchar *)&hash);
  pSVar1 = this->provider;
  if (pSVar1 != (SigningProvider *)0x0) {
    iVar2 = (*pSVar1->_vptr_SigningProvider[2])(pSVar1,&stack0xfffffffffffffef8,&subscript);
    if ((char)iVar2 != '\0') {
      ProcessSubScript(this,&subscript,__return_storage_ptr__);
    }
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&subscript.super_CScriptBase);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue operator()(const WitnessV0ScriptHash& id) const
    {
        UniValue obj(UniValue::VOBJ);
        CScript subscript;
        CRIPEMD160 hasher;
        uint160 hash;
        hasher.Write(id.begin(), 32).Finalize(hash.begin());
        if (provider && provider->GetCScript(CScriptID(hash), subscript)) {
            ProcessSubScript(subscript, obj);
        }
        return obj;
    }